

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlCatalogGetSGMLPublic(xmlHashTablePtr catal,xmlChar *pubID)

{
  xmlChar *pxVar1;
  void *pvVar2;
  
  if (catal != (xmlHashTablePtr)0x0) {
    pxVar1 = xmlCatalogNormalizePublic(pubID);
    if ((pxVar1 != (xmlChar *)0x0) && (pubID = (xmlChar *)0x0, *pxVar1 != '\0')) {
      pubID = pxVar1;
    }
    pvVar2 = xmlHashLookup(catal,pubID);
    if ((pvVar2 == (void *)0x0) || (*(int *)((long)pvVar2 + 0x18) != 0xe)) {
      if (pxVar1 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar1);
      }
      pxVar1 = (xmlChar *)0x0;
    }
    else {
      if (pxVar1 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar1);
      }
      pxVar1 = *(xmlChar **)((long)pvVar2 + 0x30);
    }
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlCatalogGetSGMLPublic(xmlHashTablePtr catal, const xmlChar *pubID) {
    xmlCatalogEntryPtr entry;
    xmlChar *normid;

    if (catal == NULL)
	return(NULL);

    normid = xmlCatalogNormalizePublic(pubID);
    if (normid != NULL)
        pubID = (*normid != 0 ? normid : NULL);

    entry = (xmlCatalogEntryPtr) xmlHashLookup(catal, pubID);
    if (entry == NULL) {
	if (normid != NULL)
	    xmlFree(normid);
	return(NULL);
    }
    if (entry->type == SGML_CATA_PUBLIC) {
	if (normid != NULL)
	    xmlFree(normid);
	return(entry->URL);
    }
    if (normid != NULL)
        xmlFree(normid);
    return(NULL);
}